

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::ParameterizedTestFactory<deflate_bound_variant_estimate_Test>::CreateTest
          (ParameterizedTestFactory<deflate_bound_variant_estimate_Test> *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<deflate_bound_test>::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x18);
  deflate_bound_variant_estimate_Test::deflate_bound_variant_estimate_Test
            ((deflate_bound_variant_estimate_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }